

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoration_manager.cpp
# Opt level: O0

void __thiscall
spvtools::opt::analysis::DecorationManager::AddMemberDecoration
          (DecorationManager *this,uint32_t inst_id,uint32_t member,uint32_t decoration,
          uint32_t decoration_value)

{
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  initializer_list<unsigned_int> init_list_01;
  initializer_list<unsigned_int> init_list_02;
  initializer_list<spvtools::opt::Operand> __l;
  Operand *local_210;
  allocator<spvtools::opt::Operand> local_205;
  uint32_t local_204;
  iterator local_200;
  undefined8 local_1f8;
  SmallVector<unsigned_int,_2UL> local_1f0;
  uint32_t local_1c4;
  iterator local_1c0;
  undefined8 local_1b8;
  SmallVector<unsigned_int,_2UL> local_1b0;
  uint32_t local_184;
  iterator local_180;
  undefined8 local_178;
  SmallVector<unsigned_int,_2UL> local_170;
  uint32_t local_144;
  iterator local_140;
  undefined8 local_138;
  SmallVector<unsigned_int,_2UL> local_130;
  Operand local_108;
  Operand OStack_d8;
  Operand OStack_a8;
  Operand OStack_78;
  iterator local_48;
  _func_int **local_40;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_38;
  uint32_t local_20;
  uint32_t local_1c;
  uint32_t decoration_value_local;
  uint32_t decoration_local;
  uint32_t member_local;
  uint32_t inst_id_local;
  DecorationManager *this_local;
  
  local_140 = &local_144;
  local_138 = 1;
  init_list_02._M_len = 1;
  init_list_02._M_array = local_140;
  local_144 = inst_id;
  local_20 = decoration_value;
  local_1c = decoration;
  decoration_value_local = member;
  decoration_local = inst_id;
  _member_local = this;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_130,init_list_02);
  Operand::Operand(&local_108,SPV_OPERAND_TYPE_ID,&local_130);
  local_184 = decoration_value_local;
  local_180 = &local_184;
  local_178 = 1;
  init_list_01._M_len = 1;
  init_list_01._M_array = local_180;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_170,init_list_01);
  Operand::Operand(&OStack_d8,SPV_OPERAND_TYPE_LITERAL_INTEGER,&local_170);
  local_1c4 = local_1c;
  local_1c0 = &local_1c4;
  local_1b8 = 1;
  init_list_00._M_len = 1;
  init_list_00._M_array = local_1c0;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_1b0,init_list_00);
  Operand::Operand(&OStack_a8,SPV_OPERAND_TYPE_LITERAL_INTEGER,&local_1b0);
  local_204 = local_20;
  local_200 = &local_204;
  local_1f8 = 1;
  init_list._M_len = 1;
  init_list._M_array = local_200;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_1f0,init_list);
  Operand::Operand(&OStack_78,SPV_OPERAND_TYPE_LITERAL_INTEGER,&local_1f0);
  local_48 = &local_108;
  local_40 = (_func_int **)0x4;
  std::allocator<spvtools::opt::Operand>::allocator(&local_205);
  __l._M_len = (size_type)local_40;
  __l._M_array = local_48;
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
            (&local_38,__l,&local_205);
  AddDecoration(this,OpMemberDecorate,&local_38);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector(&local_38);
  std::allocator<spvtools::opt::Operand>::~allocator(&local_205);
  local_210 = (Operand *)&local_48;
  do {
    local_210 = local_210 + -1;
    Operand::~Operand(local_210);
  } while (local_210 != &local_108);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_1f0);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_1b0);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_170);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_130);
  return;
}

Assistant:

void DecorationManager::AddMemberDecoration(uint32_t inst_id, uint32_t member,
                                            uint32_t decoration,
                                            uint32_t decoration_value) {
  AddDecoration(
      spv::Op::OpMemberDecorate,
      {{spv_operand_type_t::SPV_OPERAND_TYPE_ID, {inst_id}},
       {spv_operand_type_t::SPV_OPERAND_TYPE_LITERAL_INTEGER, {member}},
       {spv_operand_type_t::SPV_OPERAND_TYPE_LITERAL_INTEGER, {decoration}},
       {spv_operand_type_t::SPV_OPERAND_TYPE_LITERAL_INTEGER,
        {decoration_value}}});
}